

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# one_valus_inst.c
# Opt level: O3

void i64Clz_op(vm *v,instruction *inst)

{
  ulong uVar1;
  uint64 uVar2;
  
  uVar2 = popU64(&v->operandStack);
  if (uVar2 == 0) {
    uVar2 = 0x40;
  }
  else {
    uVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar2 = uVar1 ^ 0x3f;
  }
  pushU64(&v->operandStack,uVar2);
  return;
}

Assistant:

void i64Clz_op(vm *v, instruction *inst) {
    stack *s = &v->operandStack;
    uint64 val = popU64(s);
    uint64 count = sizeof(uint64) * 8;
    while (val != 0) {
        val >>= 1;
        count--;
    }
    pushU64(s, count);
}